

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS
ref_geom_bspline_fit(REF_INT degree,REF_INT n_control_point,REF_DBL *t,REF_DBL *uv,REF_DBL *bundle)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  REF_STATUS RVar4;
  undefined4 extraout_var;
  REF_DBL *N;
  REF_DBL *pRVar5;
  uint uVar6;
  REF_DBL *pRVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  double *pdVar12;
  REF_DBL *pRVar13;
  ulong uVar14;
  REF_DBL *pRVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  double *pdVar19;
  uint rows;
  long lVar20;
  REF_DBL RVar21;
  
  uVar16 = (ulong)(uint)n_control_point;
  pRVar7 = uv;
  if (-1 < n_control_point + degree) {
    pRVar7 = (REF_DBL *)0x0;
    do {
      bundle[(long)pRVar7] = -1.0;
      pRVar7 = (REF_DBL *)((long)pRVar7 + 1);
    } while ((REF_DBL *)(ulong)(degree + n_control_point + 1) != pRVar7);
  }
  if (-1 < degree) {
    pRVar7 = (REF_DBL *)0x0;
    do {
      bundle[(long)pRVar7] = *t;
      pRVar7 = (REF_DBL *)((long)pRVar7 + 1);
    } while ((REF_DBL *)(ulong)(degree + 1) != pRVar7);
  }
  uVar6 = (uint)pRVar7;
  if (degree < n_control_point + -1) {
    uVar6 = 0;
    pdVar12 = t + 1;
    uVar14 = 1;
    lVar17 = 0x200000000;
    do {
      lVar1 = uVar14 + (long)degree;
      bundle[lVar1] = 0.0;
      if (0 < degree) {
        RVar21 = bundle[lVar1];
        lVar18 = lVar17;
        pdVar19 = pdVar12;
        do {
          RVar21 = RVar21 + *pdVar19 / (double)degree;
          bundle[lVar1] = RVar21;
          lVar20 = lVar18 >> 0x20;
          pdVar19 = pdVar19 + 1;
          lVar18 = lVar18 + 0x100000000;
        } while (lVar20 < lVar1);
      }
      uVar14 = uVar14 + 1;
      pdVar12 = pdVar12 + 1;
      lVar17 = lVar17 + 0x100000000;
    } while (uVar14 != (uint)(n_control_point - degree));
  }
  rows = n_control_point * 2;
  uVar14 = (ulong)rows;
  iVar9 = n_control_point * 2 + 1;
  if (-1 < degree) {
    uVar6 = degree + 1;
    uVar11 = 0;
    do {
      bundle[(long)n_control_point + uVar11] = t[n_control_point + -1];
      uVar11 = uVar11 + 1;
    } while (uVar6 != uVar11);
  }
  uVar10 = iVar9 * rows;
  if ((int)uVar10 < 0) {
    bVar2 = false;
    iVar3 = printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x111f,"ref_geom_bspline_fit","malloc ab of REF_DBL negative");
    pRVar7 = (REF_DBL *)CONCAT44(extraout_var,iVar3);
    uVar6 = 1;
  }
  else {
    pRVar7 = (REF_DBL *)malloc((ulong)uVar10 << 3);
    if (pRVar7 == (REF_DBL *)0x0) {
      bVar2 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x111f
             ,"ref_geom_bspline_fit","malloc ab of REF_DBL NULL");
      uVar6 = 2;
      pRVar7 = (REF_DBL *)0x0;
    }
    else {
      bVar2 = true;
      if (n_control_point != 0) {
        uVar11 = 1;
        if (1 < (int)uVar10) {
          uVar11 = (ulong)uVar10;
        }
        memset(pRVar7,0,uVar11 << 3);
      }
    }
  }
  if (bVar2) {
    if (n_control_point < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x1120
             ,"ref_geom_bspline_fit","malloc N of REF_DBL negative");
      uVar6 = 1;
    }
    else {
      N = (REF_DBL *)malloc(uVar16 * 8);
      if (N == (REF_DBL *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x1120,"ref_geom_bspline_fit","malloc N of REF_DBL NULL");
        uVar6 = 2;
      }
      else {
        if (n_control_point != 0) {
          pRVar13 = pRVar7 + (uVar14 + 1) * uVar16;
          uVar11 = 0;
          pRVar15 = pRVar7;
          do {
            RVar4 = ref_geom_bspline_row(degree,n_control_point,bundle,t[uVar11],N);
            if (RVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x1122,"ref_geom_bspline_fit",1,"row");
              return 1;
            }
            uVar8 = 0;
            pRVar5 = pRVar15;
            do {
              *pRVar5 = N[uVar8];
              uVar8 = uVar8 + 1;
              pRVar5 = pRVar5 + uVar14;
            } while (uVar16 != uVar8);
            pRVar7[rows * rows + uVar11] = uv[uVar11 * 2];
            uVar8 = 0;
            pRVar5 = pRVar13;
            do {
              *pRVar5 = N[uVar8];
              uVar8 = uVar8 + 1;
              pRVar5 = pRVar5 + uVar14;
            } while (uVar16 != uVar8);
            pRVar7[(rows * rows + n_control_point) + uVar11] = uv[uVar11 * 2 + 1];
            uVar11 = uVar11 + 1;
            pRVar15 = pRVar15 + 1;
            pRVar13 = pRVar13 + 1;
          } while (uVar11 != uVar16);
        }
        uVar6 = ref_matrix_solve_ab(rows,iVar9,pRVar7);
        if (uVar6 == 0) {
          if (n_control_point != 0) {
            iVar9 = 1;
            if (1 < n_control_point) {
              iVar9 = n_control_point;
            }
            uVar16 = 0;
            do {
              bundle[(long)(n_control_point + degree) + uVar16 + 1] =
                   *(REF_DBL *)((long)pRVar7 + uVar16 * 4 + (ulong)(rows * rows) * 8);
              bundle[n_control_point + degree + 2 + (int)uVar16] =
                   *(REF_DBL *)
                    ((long)pRVar7 + uVar16 * 4 + (ulong)(rows * rows + n_control_point) * 8);
              uVar16 = uVar16 + 2;
            } while ((uint)(iVar9 * 2) != uVar16);
          }
          free(N);
          uVar6 = 0;
          if (pRVar7 != (REF_DBL *)0x0) {
            free(pRVar7);
            uVar6 = 0;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x1135,"ref_geom_bspline_fit",(ulong)uVar6,"solve");
        }
      }
    }
  }
  return uVar6;
}

Assistant:

REF_FCN REF_STATUS ref_geom_bspline_fit(REF_INT degree, REF_INT n_control_point,
                                        REF_DBL *t, REF_DBL *uv,
                                        REF_DBL *bundle) {
  REF_INT rows = 2 * n_control_point;
  REF_INT cols = 2 * n_control_point + 1;
  REF_DBL *ab;
  REF_DBL *N;
  REF_INT nknot = ref_geom_bspline_nknot(degree, n_control_point);
  REF_INT i, j;
  REF_INT row, col;

  for (i = 0; i < nknot; i++) {
    bundle[i] = -1.0;
  }
  for (i = 0; i < degree + 1; i++) {
    bundle[i] = t[0];
  }
  for (j = 1; j <= ref_geom_bspline_n(degree, n_control_point) - degree; j++) {
    bundle[j + degree] = 0.0;
    for (i = j; i <= j + degree - 1; i++)
      bundle[j + degree] += t[i] / ((REF_DBL)degree);
  }
  for (i = 0; i < degree + 1; i++) {
    bundle[i + n_control_point] = t[n_control_point - 1];
  }
  ref_malloc_init(ab, rows * cols, REF_DBL, 0.0);
  ref_malloc(N, n_control_point, REF_DBL);
  for (i = 0; i < n_control_point; i++) {
    RSS(ref_geom_bspline_row(degree, n_control_point, bundle, t[i], N), "row");
    for (j = 0; j < n_control_point; j++) {
      row = i;
      col = j;
      ab[row + col * rows] = N[j];
    }
    row = i;
    col = 2 * n_control_point;
    ab[row + col * rows] = uv[0 + 2 * i];
    for (j = 0; j < n_control_point; j++) {
      row = i + n_control_point;
      col = j + n_control_point;
      ab[row + col * rows] = N[j];
    }
    row = i + n_control_point;
    col = 2 * n_control_point;
    ab[row + col * rows] = uv[1 + 2 * i];
  }

  RSS(ref_matrix_solve_ab(rows, cols, ab), "solve");
  for (i = 0; i < n_control_point; i++) {
    row = i;
    col = 2 * n_control_point;
    bundle[0 + 2 * i + nknot] = ab[row + col * rows];
    row = i + n_control_point;
    col = 2 * n_control_point;
    bundle[1 + 2 * i + nknot] = ab[row + col * rows];
  }
  ref_free(N);
  ref_free(ab);
  return REF_SUCCESS;
}